

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O1

void __thiscall
btConvexHullInternal::computeInternal
          (btConvexHullInternal *this,int start,int end,IntermediateHull *result)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vertex **ppVVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Vertex *pVVar8;
  Edge *pEVar9;
  Vertex *pVVar10;
  uint end_00;
  Vertex *pVVar11;
  Vertex *pVVar12;
  ulong uVar13;
  Vertex *pVVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  IntermediateHull hull1;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar7 = end - start;
  if (iVar7 == 2) {
    pVVar14 = (this->originalVertices).m_data[start];
    iVar7 = (pVVar14->point).x;
    iVar1 = pVVar14[1].point.x;
    bVar15 = true;
    if ((iVar7 == iVar1) && ((pVVar14->point).y == pVVar14[1].point.y)) {
      bVar15 = (pVVar14->point).z != pVVar14[1].point.z;
    }
    if (bVar15) {
      pVVar12 = pVVar14 + 1;
      iVar2 = (pVVar14->point).y;
      iVar3 = pVVar14[1].point.y;
      pVVar8 = pVVar12;
      if (iVar2 == iVar3 && iVar7 == iVar1) {
        iVar1 = (pVVar14->point).z;
        iVar7 = pVVar14[1].point.z;
        if (iVar7 < iVar1) {
          pVVar12 = pVVar14;
        }
        if (iVar1 <= iVar7) {
          pVVar8 = pVVar14;
        }
        pVVar14[iVar7 < iVar1].next = pVVar14 + (iVar7 < iVar1);
        pVVar8->prev = pVVar8;
        result->minXy = pVVar8;
        result->maxXy = pVVar8;
        pVVar10 = pVVar8;
        pVVar14 = pVVar8;
      }
      else {
        bVar5 = iVar7 < iVar1;
        pVVar14->next = pVVar12;
        pVVar14->prev = pVVar12;
        pVVar14[1].next = pVVar14;
        pVVar14[1].prev = pVVar14;
        bVar6 = iVar2 < iVar3;
        pVVar11 = pVVar14;
        pVVar10 = pVVar12;
        if (iVar7 == iVar1 && bVar6 || bVar5) {
          pVVar11 = pVVar12;
          pVVar10 = pVVar14;
        }
        result->minXy = pVVar10;
        if (iVar2 == iVar3 && bVar5 || bVar6) {
          pVVar8 = pVVar14;
        }
        result->maxXy = pVVar11;
        pVVar10 = pVVar14;
        if (iVar2 == iVar3 && bVar5 || bVar6) {
          pVVar10 = pVVar12;
        }
      }
      result->minYx = pVVar8;
      result->maxYx = pVVar10;
      pEVar9 = newEdgePair(this,pVVar14,pVVar12);
      pEVar9->next = pEVar9;
      pEVar9->prev = pEVar9;
      pVVar14->edges = pEVar9;
      pEVar9 = pEVar9->reverse;
      pEVar9->next = pEVar9;
      pEVar9->prev = pEVar9;
      pVVar12->edges = pEVar9;
      if (bVar15) {
        return;
      }
    }
  }
  else if (iVar7 != 1) {
    if (iVar7 != 0) {
      end_00 = iVar7 / 2 + start;
      uVar13 = (ulong)end_00;
      if ((int)end_00 < end) {
        ppVVar4 = (this->originalVertices).m_data;
        uVar13 = (ulong)(int)end_00;
        pVVar14 = ppVVar4[uVar13 - 1];
        do {
          pVVar12 = ppVVar4[uVar13];
          if ((((pVVar12->point).x != (pVVar14->point).x) ||
              ((pVVar12->point).y != (pVVar14->point).y)) ||
             ((pVVar12->point).z != (pVVar14->point).z)) goto LAB_001292e1;
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)end);
        uVar13 = (ulong)(uint)end;
      }
LAB_001292e1:
      computeInternal(this,start,end_00,result);
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      computeInternal(this,(int)uVar13,end,(IntermediateHull *)local_58);
      merge(this,result,(IntermediateHull *)local_58);
      return;
    }
    auVar16 = (undefined1  [16])0x0;
    goto LAB_001293d5;
  }
  pVVar14 = (this->originalVertices).m_data[start];
  pVVar14->edges = (Edge *)0x0;
  pVVar14->next = pVVar14;
  pVVar14->prev = pVVar14;
  auVar16._8_4_ = (int)pVVar14;
  auVar16._0_8_ = pVVar14;
  auVar16._12_4_ = (int)((ulong)pVVar14 >> 0x20);
LAB_001293d5:
  result->minYx = (Vertex *)auVar16._0_8_;
  result->maxYx = (Vertex *)auVar16._8_8_;
  result->minXy = (Vertex *)auVar16._0_8_;
  result->maxXy = (Vertex *)auVar16._8_8_;
  return;
}

Assistant:

void btConvexHullInternal::computeInternal(int start, int end, IntermediateHull& result)
{
	int n = end - start;
	switch (n)
	{
		case 0:
			result.minXy = NULL;
			result.maxXy = NULL;
			result.minYx = NULL;
			result.maxYx = NULL;
			return;
		case 2:
		{
			Vertex* v = originalVertices[start];
			Vertex* w = v + 1;
			if (v->point != w->point)
			{
				int32_t dx = v->point.x - w->point.x;
				int32_t dy = v->point.y - w->point.y;

				if ((dx == 0) && (dy == 0))
				{
					if (v->point.z > w->point.z)
					{
						Vertex* t = w;
						w = v;
						v = t;
					}
					btAssert(v->point.z < w->point.z);
					v->next = v;
					v->prev = v;
					result.minXy = v;
					result.maxXy = v;
					result.minYx = v;
					result.maxYx = v;
				}
				else
				{
					v->next = w;
					v->prev = w;
					w->next = v;
					w->prev = v;

					if ((dx < 0) || ((dx == 0) && (dy < 0)))
					{
						result.minXy = v;
						result.maxXy = w;
					}
					else
					{
						result.minXy = w;
						result.maxXy = v;
					}

					if ((dy < 0) || ((dy == 0) && (dx < 0)))
					{
						result.minYx = v;
						result.maxYx = w;
					}
					else
					{
						result.minYx = w;
						result.maxYx = v;
					}
				}

				Edge* e = newEdgePair(v, w);
				e->link(e);
				v->edges = e;

				e = e->reverse;
				e->link(e);
				w->edges = e;

				return;
			}
		}
		// lint -fallthrough
		case 1:
		{
			Vertex* v = originalVertices[start];
			v->edges = NULL;
			v->next = v;
			v->prev = v;

			result.minXy = v;
			result.maxXy = v;
			result.minYx = v;
			result.maxYx = v;

			return;
		}
	}

	int split0 = start + n / 2;
	Point32 p = originalVertices[split0-1]->point;
	int split1 = split0;
	while ((split1 < end) && (originalVertices[split1]->point == p))
	{
		split1++;
	}
	computeInternal(start, split0, result);
	IntermediateHull hull1;
	computeInternal(split1, end, hull1);
#ifdef DEBUG_CONVEX_HULL
	printf("\n\nMerge\n");
	result.print();
	hull1.print();
#endif
	merge(result, hull1);
#ifdef DEBUG_CONVEX_HULL
	printf("\n  Result\n");
	result.print();
#endif
}